

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttpload.c
# Opt level: O0

FT_Error tt_face_load_loca(TT_Face face,FT_Stream stream)

{
  bool bVar1;
  ulong uVar2;
  TT_Table pTVar3;
  FT_ULong FVar4;
  ulong uVar5;
  uchar *local_70;
  FT_Long diff;
  ulong uStack_58;
  FT_Bool found;
  FT_Long dist;
  FT_Long pos;
  TT_Table limit;
  TT_Table entry;
  FT_ULong new_loca_len;
  ulong uStack_28;
  FT_Int shift;
  FT_ULong table_len;
  FT_Stream pFStack_18;
  FT_Error error;
  FT_Stream stream_local;
  TT_Face face_local;
  
  pFStack_18 = stream;
  stream_local = (FT_Stream)face;
  table_len._4_4_ = (*face->goto_table)(face,0x676c7966,stream,&face->glyf_len);
  if ((table_len._4_4_ & 0xff) == 0x8e) {
    stream_local[0xe].size = 0;
    stream_local[0xe].pos = 0;
  }
  else {
    if (table_len._4_4_ != 0) {
      return table_len._4_4_;
    }
    if (*(long *)(stream_local[3].base + 0x68) == 0) {
      FVar4 = FT_Stream_Pos(pFStack_18);
      stream_local[0xe].pos = FVar4;
    }
    else {
      stream_local[0xe].pos = 0;
    }
  }
  table_len._4_4_ =
       (*(code *)stream_local[10].pathname)
                 (stream_local,0x6c6f6361,pFStack_18,&stack0xffffffffffffffd8);
  if (table_len._4_4_ == 0) {
    if (*(short *)((long)&stream_local[4].cursor + 6) == 0) {
      new_loca_len._4_1_ = 1;
      if (0x1ffff < uStack_28) {
        uStack_28 = 0x1ffff;
      }
      stream_local[0xf].base = (uchar *)(uStack_28 >> 1);
    }
    else {
      new_loca_len._4_1_ = 2;
      if (0x3ffff < uStack_28) {
        uStack_28 = 0x3ffff;
      }
      stream_local[0xf].base = (uchar *)(uStack_28 >> 2);
    }
    if ((stream_local[0xf].base != (uchar *)((stream_local->pathname).value + 1)) &&
       (stream_local[0xf].base <= (stream_local->pathname).pointer)) {
      uVar2 = (stream_local->pathname).value + 1 << new_loca_len._4_1_;
      limit = (TT_Table)stream_local[3].memory;
      pTVar3 = limit + (int)(uint)*(ushort *)&stream_local[3].close;
      FVar4 = FT_Stream_Pos(pFStack_18);
      uStack_58 = 0x7fffffff;
      bVar1 = false;
      for (; limit < pTVar3; limit = limit + 1) {
        uVar5 = limit->Offset - FVar4;
        if ((0 < (long)uVar5) && ((long)uVar5 < (long)uStack_58)) {
          bVar1 = true;
          uStack_58 = uVar5;
        }
      }
      if (!bVar1) {
        uStack_58 = pFStack_18->size - FVar4;
      }
      if (uStack_58 < uVar2) {
        if (stream_local[0xf].base == (uchar *)0x0) {
          local_70 = (uchar *)0x0;
        }
        else {
          local_70 = stream_local[0xf].base + -1;
        }
        (stream_local->pathname).pointer = local_70;
      }
      else {
        stream_local[0xf].base = (uchar *)((stream_local->pathname).value + 1);
        uStack_28 = uVar2;
      }
    }
    table_len._4_4_ =
         FT_Stream_ExtractFrame(pFStack_18,uStack_28,(FT_Byte **)&stream_local[0xf].size);
  }
  else {
    table_len._4_4_ = 0x90;
  }
  return table_len._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_loca( TT_Face    face,
                     FT_Stream  stream )
  {
    FT_Error  error;
    FT_ULong  table_len;
    FT_Int    shift;


    /* we need the size of the `glyf' table for malformed `loca' tables */
    error = face->goto_table( face, TTAG_glyf, stream, &face->glyf_len );

    /* it is possible that a font doesn't have a glyf table at all */
    /* or its size is zero                                         */
    if ( FT_ERR_EQ( error, Table_Missing ) )
    {
      face->glyf_len    = 0;
      face->glyf_offset = 0;
    }
    else if ( error )
      goto Exit;
    else
    {
#ifdef FT_CONFIG_OPTION_INCREMENTAL
      if ( face->root.internal->incremental_interface )
        face->glyf_offset = 0;
      else
#endif
        face->glyf_offset = FT_STREAM_POS();
    }

    FT_TRACE2(( "Locations " ));
    error = face->goto_table( face, TTAG_loca, stream, &table_len );
    if ( error )
    {
      error = FT_THROW( Locations_Missing );
      goto Exit;
    }

    if ( face->header.Index_To_Loc_Format != 0 )
    {
      shift = 2;

      if ( table_len >= 0x40000L )
      {
        FT_TRACE2(( "table too large\n" ));
        table_len = 0x3FFFFL;
      }
      face->num_locations = table_len >> shift;
    }
    else
    {
      shift = 1;

      if ( table_len >= 0x20000L )
      {
        FT_TRACE2(( "table too large\n" ));
        table_len = 0x1FFFFL;
      }
      face->num_locations = table_len >> shift;
    }

    if ( face->num_locations != (FT_ULong)face->root.num_glyphs + 1 )
    {
      FT_TRACE2(( "glyph count mismatch!  loca: %d, maxp: %d\n",
                  face->num_locations - 1, face->root.num_glyphs ));

      /* we only handle the case where `maxp' gives a larger value */
      if ( face->num_locations <= (FT_ULong)face->root.num_glyphs )
      {
        FT_ULong  new_loca_len =
                    ( (FT_ULong)face->root.num_glyphs + 1 ) << shift;

        TT_Table  entry = face->dir_tables;
        TT_Table  limit = entry + face->num_tables;

        FT_Long  pos   = (FT_Long)FT_STREAM_POS();
        FT_Long  dist  = 0x7FFFFFFFL;
        FT_Bool  found = 0;


        /* compute the distance to next table in font file */
        for ( ; entry < limit; entry++ )
        {
          FT_Long  diff = (FT_Long)entry->Offset - pos;


          if ( diff > 0 && diff < dist )
          {
            dist  = diff;
            found = 1;
          }
        }

        if ( !found )
        {
          /* `loca' is the last table */
          dist = (FT_Long)stream->size - pos;
        }

        if ( new_loca_len <= (FT_ULong)dist )
        {
          face->num_locations = (FT_ULong)face->root.num_glyphs + 1;
          table_len           = new_loca_len;

          FT_TRACE2(( "adjusting num_locations to %d\n",
                      face->num_locations ));
        }
        else
        {
          face->root.num_glyphs = face->num_locations
                                    ? (FT_Long)face->num_locations - 1 : 0;

          FT_TRACE2(( "adjusting num_glyphs to %d\n",
                      face->root.num_glyphs ));
        }
      }
    }

    /*
     * Extract the frame.  We don't need to decompress it since
     * we are able to parse it directly.
     */
    if ( FT_FRAME_EXTRACT( table_len, face->glyph_locations ) )
      goto Exit;

    FT_TRACE2(( "loaded\n" ));

  Exit:
    return error;
  }